

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

bool common::WriteSettings
               (path *path,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *values,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *errors)

{
  uint uVar1;
  long lVar2;
  string str;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  _Base_ptr p_Var3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  undefined1 in_stack_fffffffffffffc20 [24];
  undefined1 auStack_3c8 [8];
  undefined1 local_3c0 [32];
  ofstream file;
  undefined1 auStack_398 [40];
  uint auStack_380 [120];
  UniValue local_1a0;
  string local_148 [32];
  UniValue local_128;
  string local_d0 [32];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  SettingsValue out;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  str._8_24_ = in_stack_fffffffffffffc20;
  str._M_dataplus._M_p = (pointer)errors;
  UniValue::UniValue(&out,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string
            (local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (anonymous_namespace)::SETTINGS_WARN_MSG_KEY_abi_cxx11_);
  tinyformat::format<char[13]>
            ((string *)&file,
             "This file is automatically generated and updated by %s. Please do not edit this file while the node is running, as any changes might be ignored or overwritten."
             ,(char (*) [13])"Bitcoin Core");
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
  key._M_string_length = in_stack_fffffffffffffc20._0_8_;
  key.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_fffffffffffffc20._8_16_;
  key._M_dataplus._M_p = (pointer)errors;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_file;
  val._0_40_ = _auStack_3c8;
  val._48_40_ = auStack_398;
  UniValue::pushKV(&out,key,val);
  UniValue::~UniValue(&local_128);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string(local_d0);
  for (p_Var3 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(values->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    std::__cxx11::string::string
              (local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    UniValue::UniValue(&local_1a0,(UniValue *)(p_Var3 + 2));
    key_00._M_string_length = in_stack_fffffffffffffc20._0_8_;
    key_00.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffffc20._8_16_;
    key_00._M_dataplus._M_p = (pointer)errors;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_file;
    val_00._0_40_ = _auStack_3c8;
    val_00._48_40_ = auStack_398;
    UniValue::pushKVEnd(&out,key_00,val_00);
    UniValue::~UniValue(&local_1a0);
    std::__cxx11::string::~string(local_148);
  }
  std::ofstream::ofstream(&file);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<fs::path>(&file,path,_S_out);
  uVar1 = *(uint *)((long)((long)register0x00000020 + -0x380) + *(long *)(_file + -0x18));
  if ((uVar1 & 5) == 0) {
    UniValue::write_abi_cxx11_((UniValue *)(auStack_3c8 + 8),(int)&out,(void *)0x4,1);
    poVar4 = std::operator<<((ostream *)&file,(string *)(auStack_3c8 + 8));
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)(auStack_3c8 + 8));
    std::ofstream::close();
  }
  else {
    std::filesystem::__cxx11::path::string((string *)&stack0xfffffffffffffc20,&path->super_path);
    tinyformat::format<std::__cxx11::string>
              ((string *)(auStack_3c8 + 8),
               (tinyformat *)"Error: Unable to open settings file %s for writing",
               &stack0xfffffffffffffc20,in_RCX);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (auStack_3c8 + 8));
    std::__cxx11::string::~string((string *)(auStack_3c8 + 8));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc20);
  }
  std::ofstream::~ofstream(&file);
  UniValue::~UniValue(&out);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (uVar1 & 5) == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteSettings(const fs::path& path,
    const std::map<std::string, SettingsValue>& values,
    std::vector<std::string>& errors)
{
    SettingsValue out(SettingsValue::VOBJ);
    // Add auto-generated warning comment
    out.pushKV(SETTINGS_WARN_MSG_KEY, strprintf("This file is automatically generated and updated by %s. Please do not edit this file while the node "
                                                "is running, as any changes might be ignored or overwritten.", PACKAGE_NAME));
    // Push settings values
    for (const auto& value : values) {
        out.pushKVEnd(value.first, value.second);
    }
    std::ofstream file;
    file.open(path);
    if (file.fail()) {
        errors.emplace_back(strprintf("Error: Unable to open settings file %s for writing", fs::PathToString(path)));
        return false;
    }
    file << out.write(/* prettyIndent= */ 4, /* indentLevel= */ 1) << std::endl;
    file.close();
    return true;
}